

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# objectivec_helpers.cc
# Opt level: O1

string * __thiscall
google::protobuf::compiler::objectivec::FileClassPrefix_abi_cxx11_
          (string *__return_storage_ptr__,objectivec *this,FileDescriptor *file)

{
  ulong uVar1;
  key_type *__k;
  long lVar2;
  protobuf *this_00;
  char *size;
  undefined8 uVar3;
  bool bVar4;
  undefined8 *puVar5;
  long *plVar6;
  ostream *poVar7;
  const_iterator cVar8;
  pointer pbVar9;
  ulong uVar10;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_R8;
  __hashtable *__h;
  string *input;
  StringPiece full;
  string error_str;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  segments;
  size_type __dnew;
  SimpleLineCollector collector;
  string local_e8;
  undefined1 local_c8 [24];
  long lStack_b0;
  pointer local_a8;
  undefined8 local_a0;
  undefined1 local_98 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_88;
  ulong local_78 [2];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_68;
  ulong *local_60;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_58;
  ulong local_50 [2];
  LineConsumer local_40;
  undefined *local_38;
  
  if ((*(byte *)(*(long *)(this + 0x78) + 0x28) & 8) != 0) {
    plVar6 = (long *)(*(ulong *)(*(long *)(this + 0x78) + 0x60) & 0xfffffffffffffffe);
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    lVar2 = *plVar6;
    std::__cxx11::string::_M_construct<char*>
              ((string *)__return_storage_ptr__,lVar2,plVar6[1] + lVar2);
    return __return_storage_ptr__;
  }
  if (((anonymous_namespace)::g_prefix_mode != '\x01') ||
     (__k = *(key_type **)(this + 8), __k->_M_string_length == 0)) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    goto LAB_0026ea04;
  }
  if ((DAT_004e6378 == 0) && (DAT_004e6348 != 0)) {
    local_e8._M_dataplus._M_p = (pointer)&local_e8.field_2;
    local_e8._M_string_length = 0;
    local_e8.field_2._M_local_buf[0] = '\0';
    local_40._vptr_LineConsumer = (_func_int **)&PTR__LineConsumer_004dd198;
    local_38 = &DAT_004e6360;
    bVar4 = ParseSimpleFile((string *)&DAT_004e6340,&local_40,&local_e8);
    if (!bVar4) {
      if (local_e8._M_string_length == 0) {
        local_60 = local_50;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_60,"protoc:0: warning: Failed to parse","");
        local_88._M_allocated_capacity = (size_type)local_78;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)(local_98 + 0x10)," package prefix exceptions file: ","");
        uVar1 = (long)&(local_58->
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       )._M_impl.super__Vector_impl_data._M_start + local_88._8_8_;
        uVar10 = 0xf;
        if (local_60 != local_50) {
          uVar10 = local_50[0];
        }
        if (uVar10 < uVar1) {
          uVar10 = 0xf;
          if ((ulong *)local_88._M_allocated_capacity != local_78) {
            uVar10 = local_78[0];
          }
          if (uVar10 < uVar1) goto LAB_0026e7af;
          puVar5 = (undefined8 *)
                   std::__cxx11::string::replace
                             ((ulong)(local_98 + 0x10),0,(char *)0x0,(ulong)local_60);
          in_R8 = local_58;
        }
        else {
LAB_0026e7af:
          puVar5 = (undefined8 *)
                   std::__cxx11::string::_M_append((char *)&local_60,local_88._M_allocated_capacity)
          ;
          in_R8 = local_58;
        }
        local_a8 = (pointer)local_98;
        pbVar9 = (pointer)(puVar5 + 2);
        if ((pointer)*puVar5 == pbVar9) {
          local_98._0_8_ = (pbVar9->_M_dataplus)._M_p;
          local_98._8_8_ = puVar5[3];
        }
        else {
          local_98._0_8_ = (pbVar9->_M_dataplus)._M_p;
          local_a8 = (pointer)*puVar5;
        }
        local_a0 = puVar5[1];
        *puVar5 = pbVar9;
        puVar5[1] = 0;
        *(undefined1 *)&(pbVar9->_M_dataplus)._M_p = 0;
        plVar6 = (long *)std::__cxx11::string::_M_append((char *)&local_a8,DAT_004e6340);
        pbVar9 = (pointer)(plVar6 + 2);
        if ((pointer)*plVar6 == pbVar9) {
          local_c8._16_8_ = (pbVar9->_M_dataplus)._M_p;
          lStack_b0 = plVar6[3];
          local_c8._0_8_ = (pointer)(local_c8 + 0x10);
        }
        else {
          local_c8._16_8_ = (pbVar9->_M_dataplus)._M_p;
          local_c8._0_8_ = (pointer)*plVar6;
        }
        local_c8._8_8_ = plVar6[1];
        *plVar6 = (long)pbVar9;
        plVar6[1] = 0;
        *(undefined1 *)(plVar6 + 2) = 0;
        std::__cxx11::string::operator=((string *)&local_e8,(string *)local_c8);
        if ((pointer)local_c8._0_8_ != (pointer)(local_c8 + 0x10)) {
          operator_delete((void *)local_c8._0_8_);
        }
        if (local_a8 != (pointer)local_98) {
          operator_delete(local_a8);
        }
        if ((ulong *)local_88._M_allocated_capacity != local_78) {
          operator_delete((void *)local_88._M_allocated_capacity);
        }
        if (local_60 != local_50) {
          operator_delete(local_60);
        }
      }
      poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)&std::cerr,local_e8._M_dataplus._M_p,local_e8._M_string_length)
      ;
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
      std::ostream::put((char)poVar7);
      std::ostream::flush();
      std::ostream::flush();
      std::
      _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
      ::clear((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
               *)&DAT_004e6360);
    }
    if (DAT_004e6378 == 0) {
      local_a8 = (pointer)0x14;
      local_c8._0_8_ = (pointer)(local_c8 + 0x10);
      local_c8._0_8_ = std::__cxx11::string::_M_create((ulong *)local_c8,(ulong)&local_a8);
      local_c8._16_8_ = local_a8;
      *(undefined4 *)&(((pointer)local_c8._0_8_)->_M_dataplus)._M_p = 0x746f6e3c;
      builtin_strncpy((char *)((long)&(((pointer)local_c8._0_8_)->_M_dataplus)._M_p + 4)," a r",4);
      *(undefined4 *)&((pointer)local_c8._0_8_)->_M_string_length = 0x206c6165;
      builtin_strncpy((char *)((long)&((pointer)local_c8._0_8_)->_M_string_length + 4),"pack",4);
      *(undefined4 *)&((pointer)local_c8._0_8_)->field_2 = 0x3e656761;
      local_c8._8_8_ = local_a8;
      *(undefined1 *)
       ((long)&(((pointer)local_c8._0_8_)->_M_dataplus)._M_p + (long)&(local_a8->_M_dataplus)._M_p)
           = 0;
      local_a8 = (pointer)&DAT_004e6360;
      std::
      _Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
      ::
      _M_insert<std::__cxx11::string,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<std::__cxx11::string,true>>>>
                ((_Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                  *)&DAT_004e6360);
      if ((pointer)local_c8._0_8_ != (pointer)(local_c8 + 0x10)) {
        operator_delete((void *)local_c8._0_8_);
      }
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
      operator_delete(local_e8._M_dataplus._M_p);
    }
  }
  cVar8 = std::
          _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
          ::find((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                  *)&DAT_004e6360,__k);
  local_68 = &__return_storage_ptr__->field_2;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)local_68;
  if (cVar8.
      super__Node_iterator_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
      ._M_cur == (__node_type *)0x0) {
    __return_storage_ptr__->_M_string_length = 0;
    (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
    this_00 = (protobuf *)**(undefined8 **)(this + 8);
    size = (char *)(*(undefined8 **)(this + 8))[1];
    if ((long)size < 0) {
      stringpiece_internal::StringPiece::LogFatalSizeTooBig
                ((size_t)size,"string length exceeds max size");
    }
    local_c8._0_8_ = (string *)0x0;
    local_c8._8_8_ = (string *)0x0;
    local_c8._16_8_ = (pointer)0x0;
    full.length_ = (size_type)".";
    full.ptr_ = size;
    SplitStringUsing(this_00,full,local_c8,in_R8);
    uVar3 = local_c8._8_8_;
    if (local_c8._0_8_ != local_c8._8_8_) {
      input = (string *)local_c8._0_8_;
      do {
        anon_unknown_0::UnderscoresToCamelCase(&local_e8,input,true);
        if (local_e8._M_string_length != 0) {
          if (__return_storage_ptr__->_M_string_length != 0) {
            std::__cxx11::string::append((char *)__return_storage_ptr__);
          }
          std::__cxx11::string::_M_append
                    ((char *)__return_storage_ptr__,(ulong)local_e8._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
          operator_delete(local_e8._M_dataplus._M_p);
        }
        input = input + 1;
      } while (input != (string *)uVar3);
    }
    if (__return_storage_ptr__->_M_string_length != 0) {
      std::__cxx11::string::append((char *)__return_storage_ptr__);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_c8);
    return __return_storage_ptr__;
  }
LAB_0026ea04:
  std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"");
  return __return_storage_ptr__;
}

Assistant:

std::string FileClassPrefix(const FileDescriptor* file) {
  // Always honor the file option.
  if (file->options().has_objc_class_prefix()) {
    return file->options().objc_class_prefix();
  }

  // If package prefix isn't enabled or no package, done.
  if (!g_prefix_mode.use_package_name() || file->package().empty()) {
    return "";
  }

  // If the package is in the exceptions list, done.
  if (g_prefix_mode.is_package_exempted(file->package())) {
    return "";
  }

  // Transform the package into a prefix: use the dot segments as part,
  // camelcase each one and then join them with underscores, and add an
  // underscore at the end.
  std::string result;
  const std::vector<std::string> segments = Split(file->package(), ".", true);
  for (const auto& segment : segments) {
    const std::string part = UnderscoresToCamelCase(segment, true);
    if (part.empty()) {
      continue;
    }
    if (!result.empty()) {
      result.append("_");
    }
    result.append(part);
  }
  if (!result.empty()) {
    result.append("_");
  }
  return result;
}